

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double bernoulli_cdf(int x,double a)

{
  double dVar1;
  
  if (-1 < x) {
    if (x == 0) {
      dVar1 = 1.0 - a;
    }
    else {
      dVar1 = 1.0;
    }
    return dVar1;
  }
  return 0.0;
}

Assistant:

double bernoulli_cdf ( int x, double a )

//****************************************************************************80
//
//  Purpose:
//
//    BERNOULLI_CDF evaluates the Bernoulli CDF.
//
//
//  Modified:
//
//    22 May 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the number of successes on a single trial.
//    X = 0 or 1.
//
//    Input, double A, the probability of success on one trial.
//    0.0 <= A <= 1.0.
//
//    Output, double BERNOULLI_CDF, the value of the CDF.
//
{
  double cdf;

  if ( x < 0 )
  {
    cdf = 0.0;
  }
  else if ( x == 0 )
  {
    cdf = 1.0 - a;
  }
  else
  {
    cdf = 1.0;
  }

  return cdf;
}